

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O1

void __thiscall
sjtu::
BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
::erasenonleaf(BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
               *this,int *cur,node **p,int *pp,locType *pos)

{
  locType *plVar1;
  int iVar2;
  node *pnVar3;
  locType *plVar4;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *pBVar5;
  int iVar6;
  node *pnVar7;
  long lVar8;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar9;
  long lVar10;
  undefined8 *puVar11;
  int iVar12;
  undefined8 *puVar13;
  uint uVar14;
  long lVar15;
  DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
  *pDVar16;
  ulong uVar17;
  int *piVar18;
  undefined8 *puVar19;
  long lVar20;
  long lVar21;
  undefined8 uStack_80;
  unsigned_long_long uStack_78;
  undefined8 uStack_70;
  locType *local_68;
  undefined1 *local_60;
  ulong local_58;
  BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>
  *local_50;
  int *local_48;
  int *local_40;
  uint local_34;
  
  iVar2 = *cur;
  iVar6 = pp[iVar2];
  pnVar7 = p[iVar2];
  iVar12 = pnVar7->sz;
  if (iVar6 + 1 < iVar12) {
    lVar8 = (long)iVar6 + 1;
    lVar9 = (long)iVar6 * 0x10 + 0x340;
    do {
      *(undefined8 *)((long)pnVar7 + lVar9 + -0x18) = *(undefined8 *)((long)pnVar7 + lVar9 + -8);
      *(undefined4 *)((long)pnVar7 + lVar9 + -0x10) =
           *(undefined4 *)((long)&pnVar7->field_0 + lVar9);
      (pnVar7->field_0).val[lVar8] = *(long *)((long)&pnVar7->field_0 + lVar8 * 8 + 8);
      lVar8 = lVar8 + 1;
      pnVar7 = p[iVar2];
      iVar12 = pnVar7->sz;
      lVar9 = lVar9 + 0x10;
    } while (lVar8 < iVar12);
  }
  pnVar7->sz = iVar12 + -1;
  lVar8 = (long)*cur;
  if (lVar8 == 0) {
    if (iVar12 + -1 == 0) {
      this->depth = this->depth + -1;
      uStack_80 = 0x113b62;
      DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
      ::release(this->file,this->root);
      this->root = pos[1];
      return;
    }
    pDVar16 = this->file;
    UNRECOVERED_JUMPTABLE =
         (pDVar16->
         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
         )._vptr_FileManager_Base[3];
  }
  else {
    if (iVar12 < 0x32) {
      local_40 = pp;
      if (pp[lVar8 + -1] == p[lVar8 + -1]->sz) {
        p[lVar8 + 1] = p[lVar8];
        pp[lVar8 + 1] = pp[lVar8 + -1];
        lVar8 = (long)*cur;
        pos[lVar8 + 1] = pos[lVar8];
        pp[lVar8 + -1] = p[lVar8 + -1]->sz + -1;
        lVar8 = (long)*cur;
        pos[lVar8] = (p[lVar8 + -1]->field_0).val[pp[lVar8 + -1]];
        uStack_80 = 0x11380d;
        iVar6 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])();
        p[*cur] = (node *)CONCAT44(extraout_var,iVar6);
      }
      else {
        pp[lVar8 + 1] = pp[lVar8 + -1] + 1;
        lVar8 = (long)*cur;
        pos[lVar8 + 1] = (p[lVar8 + -1]->field_0).val[pp[lVar8 + 1]];
        uStack_80 = 0x113842;
        iVar6 = (*(this->file->
                  super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
                  )._vptr_FileManager_Base[2])();
        p[(long)*cur + 1] = (node *)CONCAT44(extraout_var_00,iVar6);
      }
      lVar8 = (long)*cur;
      pnVar7 = p[iVar2];
      iVar6 = pnVar7->sz;
      uVar14 = p[lVar8 + 1]->sz + iVar6;
      if ((int)uVar14 < 99) {
        pnVar3 = p[lVar8 + -1];
        iVar12 = local_40[lVar8 + -1];
        pnVar7->keyvalue[iVar6].first = pnVar3->keyvalue[iVar12].first;
        pnVar7->keyvalue[iVar6].second = pnVar3->keyvalue[iVar12].second;
        pnVar7 = p[lVar8 + 1];
        iVar6 = pnVar7->sz;
        if (0 < iVar6) {
          lVar10 = 0x66;
          lVar9 = 0;
          do {
            (p[iVar2]->field_0).val[p[iVar2]->sz + (int)lVar9 + 1] = (pnVar7->field_0).val[lVar9];
            pnVar7 = p[iVar2];
            iVar6 = (int)lVar9 + 1 + pnVar7->sz;
            lVar9 = lVar9 + 1;
            pnVar3 = p[lVar8 + 1];
            pnVar7->keyvalue[iVar6].first = *(unsigned_long_long *)((long)pnVar3 + lVar10 * 8 + -8);
            pnVar7->keyvalue[iVar6].second = *(int *)((long)&pnVar3->field_0 + lVar10 * 8);
            pnVar7 = p[lVar8 + 1];
            iVar6 = pnVar7->sz;
            lVar10 = lVar10 + 2;
          } while (lVar9 < iVar6);
        }
        lVar8 = (pnVar7->field_0).val[iVar6];
        pnVar7 = p[iVar2];
        iVar2 = pnVar7->sz;
        pnVar7->sz = iVar6 + 1 + iVar2;
        *(long *)((long)&pnVar7->field_0 + ((long)iVar6 + (long)iVar2) * 8 + 8) = lVar8;
        uStack_80 = 0x11395b;
        (*(this->file->
          super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
          )._vptr_FileManager_Base[3])(this->file,pos + *cur);
        uStack_80 = 0x11396d;
        DynamicFileManager<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
        ::release(this->file,pos[(long)*cur + 1]);
        uStack_70._4_4_ = *cur + -1;
        uStack_80 = 0x11398b;
        erasenonleaf(this,(int *)((long)&uStack_70 + 4),p,local_40,pos);
      }
      else {
        local_68 = pos;
        local_60 = (undefined1 *)&uStack_78;
        uVar17 = (ulong)uVar14;
        lVar9 = -(uVar17 * 8 + 0x1f & 0xfffffffffffffff0);
        puVar11 = (undefined8 *)((long)&uStack_78 + lVar9);
        local_58 = uVar17 + 1;
        puVar13 = puVar11 + (uVar17 + 1) * -2;
        puVar19 = puVar13;
        do {
          *puVar19 = 0;
          *(undefined4 *)(puVar19 + 1) = 0;
          puVar19 = puVar19 + 2;
        } while (puVar19 != puVar11);
        local_34 = uVar14;
        local_50 = this;
        pnVar7 = p[iVar2];
        iVar6 = pnVar7->sz;
        lVar10 = (long)iVar6;
        if (0 < lVar10) {
          lVar21 = 0;
          do {
            *(undefined8 *)((long)puVar11 + lVar21) =
                 *(undefined8 *)((long)&pnVar7->field_0 + lVar21);
            *(undefined8 *)((long)puVar13 + lVar21 * 2) =
                 *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar21 * 2);
            *(undefined4 *)((long)puVar13 + lVar21 * 2 + 8) =
                 *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar21 * 2);
            lVar21 = lVar21 + 8;
          } while (lVar10 * 8 - lVar21 != 0);
        }
        puVar11[lVar10] = (pnVar7->field_0).val[lVar10];
        local_48 = cur;
        pnVar3 = p[(long)*cur + -1];
        iVar12 = local_40[(long)*cur + -1];
        puVar13[lVar10 * 2] = pnVar3->keyvalue[iVar12].first;
        *(int *)(puVar13 + lVar10 * 2 + 1) = pnVar3->keyvalue[iVar12].second;
        if (iVar6 < (int)local_34) {
          pnVar3 = p[lVar8 + 1];
          piVar18 = (int *)(puVar13 + lVar10 * 2 + 3);
          lVar21 = 0;
          do {
            iVar6 = (int)lVar21;
            puVar11[lVar10 + lVar21 + 1] = (pnVar3->field_0).val[iVar6];
            *(unsigned_long_long *)(piVar18 + -2) = pnVar3->keyvalue[iVar6].first;
            *piVar18 = pnVar3->keyvalue[iVar6].second;
            lVar21 = lVar21 + 1;
            piVar18 = piVar18 + 4;
          } while (uVar17 - lVar10 != lVar21);
        }
        uVar17 = local_58;
        pnVar3 = p[lVar8 + 1];
        lVar10 = (pnVar3->field_0).val[pnVar3->sz];
        puVar11[local_58] = lVar10;
        piVar18 = local_48;
        pBVar5 = local_50;
        plVar4 = local_68;
        uVar14 = (uint)(uVar17 >> 1) & 0x7fffffff;
        pnVar7->sz = uVar14;
        pnVar3->sz = local_34 - uVar14;
        pnVar7 = p[iVar2];
        iVar6 = pnVar7->sz;
        if (0 < iVar6) {
          lVar21 = 0;
          lVar20 = 0;
          do {
            (pnVar7->field_0).val[lVar20] = puVar11[lVar20];
            pnVar7 = p[iVar2];
            *(undefined8 *)((long)&pnVar7->keyvalue[0].first + lVar21) =
                 *(undefined8 *)((long)puVar13 + lVar21);
            *(undefined4 *)((long)&pnVar7->keyvalue[0].second + lVar21) =
                 *(undefined4 *)((long)puVar13 + lVar21 + 8);
            lVar20 = lVar20 + 1;
            pnVar7 = p[iVar2];
            iVar6 = pnVar7->sz;
            lVar21 = lVar21 + 0x10;
          } while (lVar20 < iVar6);
        }
        (pnVar7->field_0).val[iVar6] = puVar11[iVar6];
        iVar6 = p[iVar2]->sz;
        pnVar7 = p[(long)*local_48 + -1];
        iVar12 = local_40[(long)*local_48 + -1];
        pnVar7->keyvalue[iVar12].first = puVar13[(long)iVar6 * 2];
        pnVar7->keyvalue[iVar12].second = *(int *)(puVar13 + (long)iVar6 * 2 + 1);
        pnVar7 = p[lVar8 + 1];
        iVar6 = pnVar7->sz;
        if (0 < iVar6) {
          lVar21 = 0x66;
          lVar20 = 0;
          do {
            (pnVar7->field_0).val[lVar20] =
                 *(long *)((long)&uStack_70 + (p[iVar2]->sz + lVar20) * 8 + lVar9);
            lVar15 = p[iVar2]->sz + lVar20;
            pnVar7 = p[lVar8 + 1];
            *(undefined8 *)((long)pnVar7 + lVar21 * 8 + -8) = puVar13[lVar15 * 2 + 2];
            *(undefined4 *)((long)&pnVar7->field_0 + lVar21 * 8) =
                 *(undefined4 *)(puVar13 + lVar15 * 2 + 3);
            lVar20 = lVar20 + 1;
            pnVar7 = p[lVar8 + 1];
            iVar6 = pnVar7->sz;
            lVar21 = lVar21 + 2;
          } while (lVar20 < iVar6);
        }
        (pnVar7->field_0).val[iVar6] = lVar10;
        pDVar16 = local_50->file;
        plVar1 = local_68 + *local_48;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar13[-1] = 0x113c4a;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar1);
        pDVar16 = pBVar5->file;
        iVar2 = *piVar18;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar13[-1] = 0x113c60;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar4 + (long)iVar2 + 1);
        pDVar16 = pBVar5->file;
        iVar2 = *piVar18;
        UNRECOVERED_JUMPTABLE =
             (pDVar16->
             super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
             )._vptr_FileManager_Base[3];
        puVar13[-1] = 0x113c76;
        (*UNRECOVERED_JUMPTABLE)(pDVar16,plVar4 + (long)iVar2 + -1);
      }
      return;
    }
    pDVar16 = this->file;
    pos = pos + lVar8;
    UNRECOVERED_JUMPTABLE =
         (pDVar16->
         super_FileManager_Base<sjtu::BplusTree<std::pair<unsigned_long_long,_int>,_long,_100,_std::less<std::pair<unsigned_long_long,_int>_>_>::node>
         )._vptr_FileManager_Base[3];
  }
  (*UNRECOVERED_JUMPTABLE)(pDVar16,pos);
  return;
}

Assistant:

void erasenonleaf(const int &cur, node **p, int *pp, locType *pos) {
            node *&x = p[cur];
            int i, j = pp[cur];
            for (i = j + 1; i < x->sz; ++i)x->keyvalue[i - 1] = x->keyvalue[i], x->pointer[i] = x->pointer[i + 1];
            --x->sz;
            if (!cur) {
                if (!x->sz) {
                    --depth;
                    file->release(root);
                    root = pos[1];
                } else {
                    file->save(pos[0]);
                }
                return;
            }
            if (x->sz >= degree - 1 >> 1) {
                file->save(pos[cur]);
                return;
            }
            if (pp[cur - 1] == p[cur - 1]->sz) {
                p[cur + 1] = p[cur];
                pp[cur + 1] = pp[cur - 1];
                pos[cur + 1] = pos[cur];
                pp[cur - 1] = p[cur - 1]->sz - 1;
                pos[cur] = p[cur - 1]->pointer[pp[cur - 1]];
                p[cur] = file->read(pos[cur]);
            } else {
                pp[cur + 1] = pp[cur - 1] + 1;
                pos[cur + 1] = p[cur - 1]->pointer[pp[cur + 1]];
                p[cur + 1] = file->read(pos[cur + 1]);
            }
            node *&y = p[cur + 1];
            if (x->sz + y->sz < degree - 1) {
                x->keyvalue[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = 0; i < y->sz; ++i)
                    x->pointer[x->sz + 1 + i] = y->pointer[i], x->keyvalue[x->sz + 1 + i] = y->keyvalue[i];
                x->pointer[x->sz += 1 + y->sz] = y->pointer[y->sz];
                file->save(pos[cur]);
                file->release(pos[cur + 1]);
                erasenonleaf(cur - 1, p, pp, pos);
            } else {
                int newsz = x->sz + y->sz + 1;
                locType tmpp[newsz + 1];
                Key tmpk[newsz], old = y->keyvalue[0];
                for (i = 0; i < x->sz; ++i)tmpp[i] = x->pointer[i], tmpk[i] = x->keyvalue[i];
                tmpp[x->sz] = x->pointer[x->sz];
                tmpk[x->sz] = p[cur - 1]->keyvalue[pp[cur - 1]];
                for (i = x->sz + 1; i < newsz; ++i)
                    tmpp[i] = y->pointer[i - x->sz - 1], tmpk[i] = y->keyvalue[i - x->sz - 1];
                tmpp[newsz] = y->pointer[y->sz];
                x->sz = newsz >> 1;
                y->sz = newsz - x->sz - 1;
                for (i = 0; i < x->sz; ++i)x->pointer[i] = tmpp[i], x->keyvalue[i] = tmpk[i];
                x->pointer[x->sz] = tmpp[x->sz];
                p[cur - 1]->keyvalue[pp[cur - 1]] = tmpk[x->sz];
                for (i = 0; i < y->sz; ++i)y->pointer[i] = tmpp[i + x->sz + 1], y->keyvalue[i] = tmpk[i + x->sz + 1];
                y->pointer[y->sz] = tmpp[newsz];
                file->save(pos[cur]);
                file->save(pos[cur + 1]);
                file->save(pos[cur - 1]);
            }
        }